

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O2

Bac_Man_t * Psr_ManBuildCba(char *pFileName,Vec_Ptr_t *vDes)

{
  uint uVar1;
  int nCapMin;
  void *__ptr;
  Vec_Ptr_t *p;
  int iVar2;
  int nCapMin_00;
  int iVar3;
  Bac_Man_t *pBVar4;
  char *pcVar5;
  size_t sVar6;
  Abc_Nam_t *pAVar7;
  Bac_Ntk_t *pBVar8;
  Psr_Ntk_t *pNtk;
  ulong uVar9;
  ulong uVar10;
  int i;
  uint uVar11;
  long lVar12;
  Vec_Int_t *p_00;
  long lVar13;
  Psr_Ntk_t *local_68;
  int local_5c;
  Vec_Int_t *local_58;
  Vec_Int_t *local_50;
  Vec_Ptr_t *local_48;
  Bac_Man_t *local_40;
  long local_38;
  
  lVar13 = 0;
  local_68 = Psr_ManNtk(vDes,0);
  uVar1 = vDes->nSize;
  pBVar4 = (Bac_Man_t *)calloc(1,0x530);
  pcVar5 = Extra_FileDesignName(pFileName);
  pBVar4->pName = pcVar5;
  if (pFileName == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pFileName);
    pcVar5 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar5,pFileName);
  }
  pBVar4->pSpec = pcVar5;
  pAVar7 = Abc_NamStart(1000,0x18);
  pBVar4->pStrs = pAVar7;
  pAVar7 = Abc_NamStart(1000,0x18);
  pBVar4->pMods = pAVar7;
  pBVar4->iRoot = 1;
  pBVar4->nNtks = uVar1;
  pBVar8 = (Bac_Ntk_t *)calloc((long)(int)uVar1 + 1,0xd0);
  pBVar4->pNtks = pBVar8;
  uVar9 = 0;
  if (0 < (int)uVar1) {
    uVar9 = (ulong)uVar1;
  }
  for (; uVar9 * 0xd0 - lVar13 != 0; lVar13 = lVar13 + 0xd0) {
    *(Bac_Man_t **)((long)&pBVar8[1].pDesign + lVar13) = pBVar4;
  }
  Bac_ManSetupTypes(pBVar4->pPrimNames,pBVar4->pPrimSymbs);
  iVar2 = Abc_NamObjNumMax(local_68->pStrs);
  iVar2 = iVar2 + 1;
  local_58 = Vec_IntAlloc(iVar2);
  local_58->nSize = iVar2;
  if (local_58->pArray != (int *)0x0) {
    memset(local_58->pArray,0xff,(long)iVar2 << 2);
  }
  local_50 = Vec_IntAlloc((local_68->vObjs).nSize);
  Abc_NamDeref(pBVar4->pStrs);
  pAVar7 = Abc_NamRef(local_68->pStrs);
  pBVar4->pStrs = pAVar7;
  lVar13 = 0xd0;
  local_48 = vDes;
  local_40 = pBVar4;
  for (lVar12 = 0; pBVar4 = local_40, p = local_48, lVar12 < local_48->nSize; lVar12 = lVar12 + 1) {
    local_68 = (Psr_Ntk_t *)Vec_PtrEntry(local_48,(int)lVar12);
    if (lVar12 < pBVar4->nNtks) {
      pBVar8 = (Bac_Ntk_t *)((long)&pBVar4->pNtks->pDesign + lVar13);
    }
    else {
      pBVar8 = (Bac_Ntk_t *)0x0;
    }
    iVar2 = local_68->iModuleName;
    iVar3 = (local_68->vInputs).nSize;
    nCapMin = (local_68->vOutputs).nSize;
    local_38 = lVar13;
    nCapMin_00 = Psr_NtkCountObjects(local_68);
    if (pBVar8->pDesign == (Bac_Man_t *)0x0) {
      __assert_fail("pNew->pDesign != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                    ,0x218,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
    }
    if ((pBVar8->vInputs).nSize != 0) {
      __assert_fail("Bac_NtkPiNum(pNew) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                    ,0x219,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
    }
    if ((pBVar8->vOutputs).nSize != 0) {
      __assert_fail("Bac_NtkPoNum(pNew) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                    ,0x21a,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
    }
    pBVar8->NameId = iVar2;
    pBVar8->iCopy = -1;
    pBVar8->iBoxNtk = -1;
    pBVar8->iBoxObj = -1;
    Vec_IntGrow(&pBVar8->vInputs,iVar3);
    Vec_IntGrow(&pBVar8->vOutputs,nCapMin);
    Vec_StrGrow(&pBVar8->vType,nCapMin_00);
    Vec_IntGrow(&pBVar8->vFanin,nCapMin_00);
    pAVar7 = pBVar8->pDesign->pMods;
    pcVar5 = Bac_NtkStr(pBVar8,iVar2);
    iVar3 = Abc_NamStrFindOrAdd(pAVar7,pcVar5,&local_5c);
    if (local_5c == 0) {
      iVar2 = Bac_NtkId(pBVar8);
      if (iVar3 != iVar2) {
        __assert_fail("NtkId == Bac_NtkId(pNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                      ,0x228,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
      }
    }
    else {
      Bac_NtkStr(pBVar8,iVar2);
      printf("Network with name %s already exists.\n");
    }
    lVar13 = local_38 + 0xd0;
  }
  if ((local_68->field_0x4 & 1) == 0) {
    if ((local_68->field_0x4 & 2) != 0) {
      iVar2 = Psr_ManIsMapped(local_68);
      if (iVar2 != 0) goto LAB_0033e4b4;
    }
  }
  else {
LAB_0033e4b4:
    iVar2 = Bac_NtkBuildLibrary(pBVar4);
    p_00 = local_58;
    if (iVar2 == 0) {
      lVar12 = 400;
      for (lVar13 = 1; lVar13 <= pBVar4->nNtks; lVar13 = lVar13 + 1) {
        pBVar8 = pBVar4->pNtks;
        Vec_IntErase((Vec_Int_t *)((long)pBVar8 + lVar12 + -0xa0));
        Vec_IntErase((Vec_Int_t *)((long)pBVar8 + lVar12 + -0x90));
        Vec_IntErase((Vec_Int_t *)((long)pBVar8 + lVar12 + -0x80));
        __ptr = *(void **)((long)pBVar8 + lVar12 + -0x68);
        if (__ptr != (void *)0x0) {
          free(__ptr);
          *(undefined8 *)((long)pBVar8 + lVar12 + -0x68) = 0;
        }
        *(undefined8 *)((long)pBVar8 + lVar12 + -0x70) = 0;
        Vec_IntErase((Vec_Int_t *)((long)pBVar8 + lVar12 + -0x60));
        Vec_IntErase((Vec_Int_t *)((long)pBVar8 + lVar12 + -0x50));
        Vec_IntErase((Vec_Int_t *)((long)pBVar8 + lVar12 + -0x40));
        Vec_IntErase((Vec_Int_t *)((long)pBVar8 + lVar12 + -0x30));
        Vec_IntErase((Vec_Int_t *)((long)pBVar8 + lVar12 + -0x20));
        Vec_IntErase((Vec_Int_t *)((long)pBVar8 + lVar12 + -0x10));
        Vec_IntErase((Vec_Int_t *)((long)&pBVar8->pDesign + lVar12));
        lVar12 = lVar12 + 0xd0;
      }
      Vec_IntErase(&pBVar4->vBuf2LeafNtk);
      Vec_IntErase(&pBVar4->vBuf2LeafObj);
      Vec_IntErase(&pBVar4->vBuf2RootNtk);
      Vec_IntErase(&pBVar4->vBuf2RootObj);
      Abc_NamDeref(pBVar4->pStrs);
      Abc_NamDeref(pBVar4->pMods);
      if (pBVar4->pName != (char *)0x0) {
        free(pBVar4->pName);
        pBVar4->pName = (char *)0x0;
      }
      if (pBVar4->pSpec != (char *)0x0) {
        free(pBVar4->pSpec);
        pBVar4->pSpec = (char *)0x0;
      }
      free(pBVar4->pNtks);
      free(pBVar4);
      pBVar4 = (Bac_Man_t *)0x0;
      goto LAB_0033e65c;
    }
  }
  p_00 = local_58;
  lVar13 = 0xd0;
  for (lVar12 = 0; lVar12 < p->nSize; lVar12 = lVar12 + 1) {
    pNtk = (Psr_Ntk_t *)Vec_PtrEntry(p,(int)lVar12);
    if (lVar12 < pBVar4->nNtks) {
      pBVar8 = (Bac_Ntk_t *)((long)&pBVar4->pNtks->pDesign + lVar13);
    }
    else {
      pBVar8 = (Bac_Ntk_t *)0x0;
    }
    Psr_ManBuildNtk(pBVar8,p,pNtk,p_00,local_50);
    lVar13 = lVar13 + 0xd0;
  }
LAB_0033e65c:
  uVar1 = p_00->nSize;
  uVar9 = 0;
  uVar10 = 0;
  if (0 < (int)uVar1) {
    uVar10 = (ulong)uVar1;
  }
  uVar11 = 0;
  for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    uVar11 = uVar11 + (p_00->pArray[uVar9] == -1);
  }
  if (uVar11 == uVar1) {
    Vec_IntFree(p_00);
    Vec_IntFree(local_50);
    return pBVar4;
  }
  __assert_fail("Vec_IntCountEntry(vMap, -1) == Vec_IntSize(vMap)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPrsBuild.c"
                ,0x157,"Bac_Man_t *Psr_ManBuildCba(char *, Vec_Ptr_t *)");
}

Assistant:

Bac_Man_t * Psr_ManBuildCba( char * pFileName, Vec_Ptr_t * vDes )
{
    Psr_Ntk_t * pNtk = Psr_ManRoot( vDes );  int i;
    Bac_Man_t * pNew = Bac_ManAlloc( pFileName, Vec_PtrSize(vDes) );
    Vec_Int_t * vMap = Vec_IntStartFull( Abc_NamObjNumMax(pNtk->pStrs) + 1 );
    Vec_Int_t * vTmp = Vec_IntAlloc( Psr_NtkBoxNum(pNtk) );
    Abc_NamDeref( pNew->pStrs );
    pNew->pStrs = Abc_NamRef( pNtk->pStrs );  
    Vec_PtrForEachEntry( Psr_Ntk_t *, vDes, pNtk, i )
        Bac_NtkAlloc( Bac_ManNtk(pNew, i+1), Psr_NtkId(pNtk), Psr_NtkPiNum(pNtk), Psr_NtkPoNum(pNtk), Psr_NtkCountObjects(pNtk) );
    if ( (pNtk->fMapped || (pNtk->fSlices && Psr_ManIsMapped(pNtk))) && !Bac_NtkBuildLibrary(pNew) )
        Bac_ManFree(pNew), pNew = NULL;
    else 
        Vec_PtrForEachEntry( Psr_Ntk_t *, vDes, pNtk, i )
            Psr_ManBuildNtk( Bac_ManNtk(pNew, i+1), vDes, pNtk, vMap, vTmp );
    assert( Vec_IntCountEntry(vMap, -1) == Vec_IntSize(vMap) );
    Vec_IntFree( vMap );
    Vec_IntFree( vTmp );
//    Vec_StrPrint( &Bac_ManNtk(pNew, 1)->vType, 1 );
    return pNew;
}